

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_ecdsa_sig_verify
              (secp256k1_scalar *sigr,secp256k1_scalar *sigs,secp256k1_ge *pubkey,
              secp256k1_scalar *message)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined4 in_EAX;
  uint uVar70;
  int iVar71;
  int iVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_scalar u2;
  secp256k1_gej pr;
  secp256k1_fe xr;
  secp256k1_gej pubkeyj;
  secp256k1_fe aux [8];
  uchar c [32];
  secp256k1_scalar local_ab8;
  secp256k1_scalar local_a98;
  secp256k1_strauss_state local_a78;
  secp256k1_scalar local_a60;
  secp256k1_gej local_a40;
  undefined1 local_9a8 [1048];
  secp256k1_gej local_590;
  secp256k1_fe local_4f8 [8];
  secp256k1_ge local_378 [8];
  
  auVar91._0_4_ = -(uint)((int)sigr->d[2] == 0 && (int)sigr->d[0] == 0);
  auVar91._4_4_ = -(uint)(*(int *)((long)sigr->d + 0x14) == 0 && *(int *)((long)sigr->d + 4) == 0);
  auVar91._8_4_ = -(uint)((int)sigr->d[3] == 0 && (int)sigr->d[1] == 0);
  auVar91._12_4_ =
       -(uint)(*(int *)((long)sigr->d + 0x1c) == 0 && *(int *)((long)sigr->d + 0xc) == 0);
  uVar70 = movmskps(in_EAX,auVar91);
  iVar72 = 0;
  if (((uVar70 ^ 0xf) != 0) &&
     (auVar92._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0),
     auVar92._4_4_ =
          -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0),
     auVar92._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0),
     auVar92._12_4_ =
          -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0),
     iVar71 = movmskps(uVar70 ^ 0xf,auVar92), iVar72 = 0, iVar71 != 0xf)) {
    secp256k1_scalar_inverse_var(&local_a98,sigs);
    uVar74 = message->d[0];
    uVar75 = message->d[1];
    uVar1 = message->d[2];
    uVar2 = message->d[3];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_a98.d[0];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar74;
    uVar76 = SUB168(auVar3 * auVar35,8);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar76;
    local_9a8._0_8_ = SUB168(auVar3 * auVar35,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_a98.d[0];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar75;
    auVar4 = auVar4 * auVar36;
    uVar81 = SUB168(auVar4 + auVar68,0);
    uVar85 = SUB168(auVar4 + auVar68,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_a98.d[1];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar74;
    uVar77 = SUB168(auVar5 * auVar37,8);
    uVar73 = SUB168(auVar5 * auVar37,0);
    local_9a8._8_8_ = uVar81 + uVar73;
    uVar73 = (ulong)CARRY8(uVar81,uVar73);
    uVar81 = uVar85 + uVar77;
    uVar86 = uVar81 + uVar73;
    uVar87 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar76,auVar4._0_8_)) +
             (ulong)(CARRY8(uVar85,uVar77) || CARRY8(uVar81,uVar73));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_a98.d[0];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar1;
    uVar78 = SUB168(auVar6 * auVar38,8);
    uVar73 = SUB168(auVar6 * auVar38,0);
    uVar76 = uVar86 + uVar73;
    uVar73 = (ulong)CARRY8(uVar86,uVar73);
    uVar77 = uVar87 + uVar78;
    uVar88 = uVar77 + uVar73;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_a98.d[1];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar75;
    uVar79 = SUB168(auVar7 * auVar39,8);
    uVar81 = SUB168(auVar7 * auVar39,0);
    uVar86 = uVar76 + uVar81;
    uVar81 = (ulong)CARRY8(uVar76,uVar81);
    uVar85 = uVar88 + uVar79;
    uVar89 = uVar85 + uVar81;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_a98.d[2];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar74;
    uVar80 = SUB168(auVar8 * auVar40,8);
    uVar76 = SUB168(auVar8 * auVar40,0);
    local_9a8._16_8_ = uVar86 + uVar76;
    uVar76 = (ulong)CARRY8(uVar86,uVar76);
    uVar86 = uVar89 + uVar80;
    uVar90 = uVar86 + uVar76;
    uVar89 = (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar77,uVar73)) +
             (ulong)(CARRY8(uVar88,uVar79) || CARRY8(uVar85,uVar81)) +
             (ulong)(CARRY8(uVar89,uVar80) || CARRY8(uVar86,uVar76));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_a98.d[0];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar2;
    uVar79 = SUB168(auVar9 * auVar41,8);
    uVar73 = SUB168(auVar9 * auVar41,0);
    uVar76 = uVar90 + uVar73;
    uVar73 = (ulong)CARRY8(uVar90,uVar73);
    uVar77 = uVar89 + uVar79;
    uVar90 = uVar77 + uVar73;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_a98.d[1];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar1;
    uVar80 = SUB168(auVar10 * auVar42,8);
    uVar81 = SUB168(auVar10 * auVar42,0);
    uVar86 = uVar76 + uVar81;
    uVar81 = (ulong)CARRY8(uVar76,uVar81);
    uVar85 = uVar90 + uVar80;
    uVar82 = uVar85 + uVar81;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_a98.d[2];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar75;
    uVar87 = SUB168(auVar11 * auVar43,8);
    uVar76 = SUB168(auVar11 * auVar43,0);
    uVar78 = uVar86 + uVar76;
    uVar76 = (ulong)CARRY8(uVar86,uVar76);
    uVar86 = uVar82 + uVar87;
    uVar83 = uVar86 + uVar76;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_a98.d[3];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar74;
    uVar88 = SUB168(auVar12 * auVar44,8);
    uVar74 = SUB168(auVar12 * auVar44,0);
    local_9a8._24_8_ = uVar78 + uVar74;
    uVar74 = (ulong)CARRY8(uVar78,uVar74);
    uVar78 = uVar83 + uVar88;
    uVar84 = uVar78 + uVar74;
    uVar79 = (ulong)(CARRY8(uVar89,uVar79) || CARRY8(uVar77,uVar73)) +
             (ulong)(CARRY8(uVar90,uVar80) || CARRY8(uVar85,uVar81)) +
             (ulong)(CARRY8(uVar82,uVar87) || CARRY8(uVar86,uVar76)) +
             (ulong)(CARRY8(uVar83,uVar88) || CARRY8(uVar78,uVar74));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_a98.d[1];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar2;
    uVar85 = SUB168(auVar13 * auVar45,8);
    uVar74 = SUB168(auVar13 * auVar45,0);
    uVar76 = uVar84 + uVar74;
    uVar74 = (ulong)CARRY8(uVar84,uVar74);
    uVar81 = uVar79 + uVar85;
    uVar80 = uVar81 + uVar74;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_a98.d[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar1;
    uVar86 = SUB168(auVar14 * auVar46,8);
    uVar73 = SUB168(auVar14 * auVar46,0);
    uVar77 = uVar76 + uVar73;
    uVar73 = (ulong)CARRY8(uVar76,uVar73);
    uVar76 = uVar80 + uVar86;
    uVar87 = uVar76 + uVar73;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_a98.d[3];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar75;
    uVar78 = SUB168(auVar15 * auVar47,8);
    uVar75 = SUB168(auVar15 * auVar47,0);
    local_9a8._32_8_ = uVar77 + uVar75;
    uVar75 = (ulong)CARRY8(uVar77,uVar75);
    uVar77 = uVar87 + uVar78;
    uVar88 = uVar77 + uVar75;
    uVar85 = (ulong)(CARRY8(uVar79,uVar85) || CARRY8(uVar81,uVar74)) +
             (ulong)(CARRY8(uVar80,uVar86) || CARRY8(uVar76,uVar73)) +
             (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar77,uVar75));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_a98.d[2];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar2;
    uVar81 = SUB168(auVar16 * auVar48,8);
    uVar74 = SUB168(auVar16 * auVar48,0);
    uVar77 = uVar88 + uVar74;
    uVar74 = (ulong)CARRY8(uVar88,uVar74);
    uVar73 = uVar85 + uVar81;
    uVar86 = uVar73 + uVar74;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_a98.d[3];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar1;
    uVar76 = SUB168(auVar17 * auVar49,8);
    uVar75 = SUB168(auVar17 * auVar49,0);
    local_9a8._40_8_ = uVar77 + uVar75;
    uVar75 = (ulong)CARRY8(uVar77,uVar75);
    uVar1 = uVar86 + uVar76;
    local_9a8._56_8_ =
         (ulong)(CARRY8(uVar85,uVar81) || CARRY8(uVar73,uVar74)) +
         (ulong)(CARRY8(uVar86,uVar76) || CARRY8(uVar1,uVar75));
    local_9a8._48_8_ = uVar1 + uVar75;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_a98.d[3];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar2;
    local_9a8._48_16_ = auVar18 * auVar50 + local_9a8._48_16_;
    secp256k1_scalar_reduce_512(&local_ab8,(uint64_t *)local_9a8);
    uVar74 = sigr->d[0];
    uVar75 = sigr->d[1];
    uVar1 = sigr->d[2];
    uVar2 = sigr->d[3];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_a98.d[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar74;
    uVar76 = SUB168(auVar19 * auVar51,8);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar76;
    local_9a8._0_8_ = SUB168(auVar19 * auVar51,0);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_a98.d[0];
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar75;
    auVar20 = auVar20 * auVar52;
    uVar81 = SUB168(auVar20 + auVar69,0);
    uVar85 = SUB168(auVar20 + auVar69,8);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_a98.d[1];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar74;
    uVar77 = SUB168(auVar21 * auVar53,8);
    uVar73 = SUB168(auVar21 * auVar53,0);
    local_9a8._8_8_ = uVar81 + uVar73;
    uVar73 = (ulong)CARRY8(uVar81,uVar73);
    uVar81 = uVar85 + uVar77;
    uVar86 = uVar81 + uVar73;
    uVar87 = (ulong)CARRY8(auVar20._8_8_,(ulong)CARRY8(uVar76,auVar20._0_8_)) +
             (ulong)(CARRY8(uVar85,uVar77) || CARRY8(uVar81,uVar73));
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_a98.d[0];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar1;
    uVar78 = SUB168(auVar22 * auVar54,8);
    uVar73 = SUB168(auVar22 * auVar54,0);
    uVar76 = uVar86 + uVar73;
    uVar73 = (ulong)CARRY8(uVar86,uVar73);
    uVar77 = uVar87 + uVar78;
    uVar88 = uVar77 + uVar73;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_a98.d[1];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar75;
    uVar79 = SUB168(auVar23 * auVar55,8);
    uVar81 = SUB168(auVar23 * auVar55,0);
    uVar86 = uVar76 + uVar81;
    uVar81 = (ulong)CARRY8(uVar76,uVar81);
    uVar85 = uVar88 + uVar79;
    uVar89 = uVar85 + uVar81;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_a98.d[2];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar74;
    uVar80 = SUB168(auVar24 * auVar56,8);
    uVar76 = SUB168(auVar24 * auVar56,0);
    local_9a8._16_8_ = uVar86 + uVar76;
    uVar76 = (ulong)CARRY8(uVar86,uVar76);
    uVar86 = uVar89 + uVar80;
    uVar90 = uVar86 + uVar76;
    uVar89 = (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar77,uVar73)) +
             (ulong)(CARRY8(uVar88,uVar79) || CARRY8(uVar85,uVar81)) +
             (ulong)(CARRY8(uVar89,uVar80) || CARRY8(uVar86,uVar76));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_a98.d[0];
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar2;
    uVar79 = SUB168(auVar25 * auVar57,8);
    uVar73 = SUB168(auVar25 * auVar57,0);
    uVar76 = uVar90 + uVar73;
    uVar73 = (ulong)CARRY8(uVar90,uVar73);
    uVar77 = uVar89 + uVar79;
    uVar90 = uVar77 + uVar73;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_a98.d[1];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar1;
    uVar80 = SUB168(auVar26 * auVar58,8);
    uVar81 = SUB168(auVar26 * auVar58,0);
    uVar86 = uVar76 + uVar81;
    uVar81 = (ulong)CARRY8(uVar76,uVar81);
    uVar85 = uVar90 + uVar80;
    uVar82 = uVar85 + uVar81;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_a98.d[2];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar75;
    uVar87 = SUB168(auVar27 * auVar59,8);
    uVar76 = SUB168(auVar27 * auVar59,0);
    uVar78 = uVar86 + uVar76;
    uVar76 = (ulong)CARRY8(uVar86,uVar76);
    uVar86 = uVar82 + uVar87;
    uVar83 = uVar86 + uVar76;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_a98.d[3];
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar74;
    uVar88 = SUB168(auVar28 * auVar60,8);
    uVar74 = SUB168(auVar28 * auVar60,0);
    local_9a8._24_8_ = uVar78 + uVar74;
    uVar74 = (ulong)CARRY8(uVar78,uVar74);
    uVar78 = uVar83 + uVar88;
    uVar84 = uVar78 + uVar74;
    uVar79 = (ulong)(CARRY8(uVar89,uVar79) || CARRY8(uVar77,uVar73)) +
             (ulong)(CARRY8(uVar90,uVar80) || CARRY8(uVar85,uVar81)) +
             (ulong)(CARRY8(uVar82,uVar87) || CARRY8(uVar86,uVar76)) +
             (ulong)(CARRY8(uVar83,uVar88) || CARRY8(uVar78,uVar74));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_a98.d[1];
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar2;
    uVar85 = SUB168(auVar29 * auVar61,8);
    uVar74 = SUB168(auVar29 * auVar61,0);
    uVar76 = uVar84 + uVar74;
    uVar74 = (ulong)CARRY8(uVar84,uVar74);
    uVar81 = uVar79 + uVar85;
    uVar80 = uVar81 + uVar74;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_a98.d[2];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar1;
    uVar86 = SUB168(auVar30 * auVar62,8);
    uVar73 = SUB168(auVar30 * auVar62,0);
    uVar77 = uVar76 + uVar73;
    uVar73 = (ulong)CARRY8(uVar76,uVar73);
    uVar76 = uVar80 + uVar86;
    uVar87 = uVar76 + uVar73;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_a98.d[3];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar75;
    uVar78 = SUB168(auVar31 * auVar63,8);
    uVar75 = SUB168(auVar31 * auVar63,0);
    local_9a8._32_8_ = uVar77 + uVar75;
    uVar75 = (ulong)CARRY8(uVar77,uVar75);
    uVar77 = uVar87 + uVar78;
    uVar88 = uVar77 + uVar75;
    uVar85 = (ulong)(CARRY8(uVar79,uVar85) || CARRY8(uVar81,uVar74)) +
             (ulong)(CARRY8(uVar80,uVar86) || CARRY8(uVar76,uVar73)) +
             (ulong)(CARRY8(uVar87,uVar78) || CARRY8(uVar77,uVar75));
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_a98.d[2];
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar2;
    uVar81 = SUB168(auVar32 * auVar64,8);
    uVar74 = SUB168(auVar32 * auVar64,0);
    uVar77 = uVar88 + uVar74;
    uVar74 = (ulong)CARRY8(uVar88,uVar74);
    uVar73 = uVar85 + uVar81;
    uVar86 = uVar73 + uVar74;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_a98.d[3];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar1;
    uVar76 = SUB168(auVar33 * auVar65,8);
    uVar75 = SUB168(auVar33 * auVar65,0);
    local_9a8._40_8_ = uVar77 + uVar75;
    uVar75 = (ulong)CARRY8(uVar77,uVar75);
    uVar1 = uVar86 + uVar76;
    auVar67._8_8_ =
         (ulong)(CARRY8(uVar85,uVar81) || CARRY8(uVar73,uVar74)) +
         (ulong)(CARRY8(uVar86,uVar76) || CARRY8(uVar1,uVar75));
    auVar67._0_8_ = uVar1 + uVar75;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_a98.d[3];
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar2;
    local_9a8._48_16_ = auVar34 * auVar66 + auVar67;
    secp256k1_scalar_reduce_512(&local_a60,(uint64_t *)local_9a8);
    secp256k1_gej_set_ge(&local_590,pubkey);
    local_a78.aux = local_4f8;
    local_a78.pre_a = local_378;
    local_a78.ps = (secp256k1_strauss_point_state *)local_9a8;
    secp256k1_ecmult_strauss_wnaf(&local_a78,&local_a40,1,&local_590,&local_a60,&local_ab8);
    secp256k1_gej_verify(&local_a40);
    if (local_a40.infinity == 0) {
      secp256k1_scalar_get_b32((uchar *)local_378,sigr);
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)local_9a8,(uchar *)local_378);
      if ((((ulong)local_9a8._0_8_ < 0xffffefffffc2f) || (local_9a8._32_8_ != 0xffffffffffff)) ||
         ((local_9a8._16_8_ & local_9a8._24_8_ & local_9a8._8_8_) != 0xfffffffffffff)) {
        local_9a8._40_4_ = 1;
        local_9a8._44_4_ = 1;
        secp256k1_fe_verify((secp256k1_fe *)local_9a8);
      }
      else {
        local_9a8._40_4_ = -1;
      }
      iVar71 = secp256k1_gej_eq_x_var((secp256k1_fe *)local_9a8,&local_a40);
      iVar72 = 1;
      if (iVar71 == 0) {
        iVar71 = secp256k1_fe_cmp_var
                           ((secp256k1_fe *)local_9a8,&secp256k1_ecdsa_const_p_minus_order);
        iVar72 = 0;
        if (iVar71 < 0) {
          secp256k1_fe_add((secp256k1_fe *)local_9a8,&secp256k1_ecdsa_const_order_as_fe);
          iVar72 = secp256k1_gej_eq_x_var((secp256k1_fe *)local_9a8,&local_a40);
        }
      }
    }
    else {
      iVar72 = 0;
    }
  }
  return iVar72;
}

Assistant:

static int secp256k1_ecdsa_sig_verify(const secp256k1_scalar *sigr, const secp256k1_scalar *sigs, const secp256k1_ge *pubkey, const secp256k1_scalar *message) {
    unsigned char c[32];
    secp256k1_scalar sn, u1, u2;
#if !defined(EXHAUSTIVE_TEST_ORDER)
    secp256k1_fe xr;
#endif
    secp256k1_gej pubkeyj;
    secp256k1_gej pr;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_inverse_var(&sn, sigs);
    secp256k1_scalar_mul(&u1, &sn, message);
    secp256k1_scalar_mul(&u2, &sn, sigr);
    secp256k1_gej_set_ge(&pubkeyj, pubkey);
    secp256k1_ecmult(&pr, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&pr)) {
        return 0;
    }

#if defined(EXHAUSTIVE_TEST_ORDER)
{
    secp256k1_scalar computed_r;
    secp256k1_ge pr_ge;
    secp256k1_ge_set_gej(&pr_ge, &pr);
    secp256k1_fe_normalize(&pr_ge.x);

    secp256k1_fe_get_b32(c, &pr_ge.x);
    secp256k1_scalar_set_b32(&computed_r, c, NULL);
    return secp256k1_scalar_eq(sigr, &computed_r);
}
#else
    secp256k1_scalar_get_b32(c, sigr);
    /* we can ignore the fe_set_b32_limit return value, because we know the input is in range */
    (void)secp256k1_fe_set_b32_limit(&xr, c);

    /** We now have the recomputed R point in pr, and its claimed x coordinate (modulo n)
     *  in xr. Naively, we would extract the x coordinate from pr (requiring a inversion modulo p),
     *  compute the remainder modulo n, and compare it to xr. However:
     *
     *        xr == X(pr) mod n
     *    <=> exists h. (xr + h * n < p && xr + h * n == X(pr))
     *    [Since 2 * n > p, h can only be 0 or 1]
     *    <=> (xr == X(pr)) || (xr + n < p && xr + n == X(pr))
     *    [In Jacobian coordinates, X(pr) is pr.x / pr.z^2 mod p]
     *    <=> (xr == pr.x / pr.z^2 mod p) || (xr + n < p && xr + n == pr.x / pr.z^2 mod p)
     *    [Multiplying both sides of the equations by pr.z^2 mod p]
     *    <=> (xr * pr.z^2 mod p == pr.x) || (xr + n < p && (xr + n) * pr.z^2 mod p == pr.x)
     *
     *  Thus, we can avoid the inversion, but we have to check both cases separately.
     *  secp256k1_gej_eq_x implements the (xr * pr.z^2 mod p == pr.x) test.
     */
    if (secp256k1_gej_eq_x_var(&xr, &pr)) {
        /* xr * pr.z^2 mod p == pr.x, so the signature is valid. */
        return 1;
    }
    if (secp256k1_fe_cmp_var(&xr, &secp256k1_ecdsa_const_p_minus_order) >= 0) {
        /* xr + n >= p, so we can skip testing the second case. */
        return 0;
    }
    secp256k1_fe_add(&xr, &secp256k1_ecdsa_const_order_as_fe);
    if (secp256k1_gej_eq_x_var(&xr, &pr)) {
        /* (xr + n) * pr.z^2 mod p == pr.x, so the signature is valid. */
        return 1;
    }
    return 0;
#endif
}